

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_NtkFindRoots(Acb_Ntk_t *p,Vec_Int_t *vTargets,Vec_Bit_t **pvBlock)

{
  uint uVar1;
  Acb_ObjType_t AVar2;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  int *piVar3;
  int Entry;
  int iVar4;
  int iVar5;
  size_t __size;
  
  p_00 = Vec_IntAlloc(1000);
  uVar1 = (p->vObjType).nSize - 1;
  iVar5 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  p_01 = (Vec_Bit_t *)malloc(0x10);
  p_01->nCap = iVar5 * 0x20;
  if (iVar5 == 0) {
    __size = 0;
    piVar3 = (int *)0x0;
  }
  else {
    __size = (long)iVar5 << 2;
    piVar3 = (int *)malloc(__size);
  }
  p_01->pArray = piVar3;
  p_01->nSize = iVar5 * 0x20;
  iVar4 = 0;
  memset(piVar3,0,__size);
  *pvBlock = p_01;
  Acb_NtkIncTravId(p);
  iVar5 = vTargets->nSize;
  if (iVar5 < 1) {
    __assert_fail("Vec_IntSize(vTargets) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                  ,0x200,"Vec_Int_t *Acb_NtkFindRoots(Acb_Ntk_t *, Vec_Int_t *, Vec_Bit_t **)");
  }
  for (; iVar4 < iVar5; iVar4 = iVar4 + 1) {
    iVar5 = Vec_IntEntry(vTargets,iVar4);
    Acb_ObjSetTravIdCur(p,iVar5);
    Vec_BitWriteEntry(p_01,iVar5,Entry);
    iVar5 = vTargets->nSize;
  }
  Acb_NtkIncTravId(p);
  for (iVar5 = 0; iVar5 < (p->vCis).nSize; iVar5 = iVar5 + 1) {
    iVar4 = Vec_IntEntry(&p->vCis,iVar5);
    Acb_ObjSetTravIdCur(p,iVar4);
  }
  for (iVar5 = 1; iVar5 < (p->vObjType).nSize; iVar5 = iVar5 + 1) {
    AVar2 = Acb_ObjType(p,iVar5);
    if (AVar2 != ABC_OPER_NONE) {
      iVar4 = Acb_ObjIsCio(p,iVar5);
      if (iVar4 == 0) {
        Acb_NtkFindRoots_rec(p,iVar5,p_01);
      }
    }
  }
  for (iVar5 = 0; iVar5 < (p->vCos).nSize; iVar5 = iVar5 + 1) {
    iVar4 = Vec_IntEntry(&p->vCos,iVar5);
    piVar3 = Acb_ObjFanins(p,iVar4);
    iVar4 = Acb_NtkFindRoots_rec(p,piVar3[1],p_01);
    if (iVar4 != 0) {
      Vec_IntPush(p_00,iVar5);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindRoots( Acb_Ntk_t * p, Vec_Int_t * vTargets, Vec_Bit_t ** pvBlock )
{
    int i, iObj;
    Vec_Int_t * vRoots = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vBlock = Vec_BitStart( Acb_NtkObjNum(p) );
    *pvBlock = vBlock;
    // mark targets
    Acb_NtkIncTravId( p );
    assert( Vec_IntSize(vTargets) > 0 );
    Vec_IntForEachEntry( vTargets, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        Vec_BitWriteEntry( vBlock, iObj, 1 );
    }
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetTravIdCur( p, iObj );
    // visit internal nodes
    Acb_NtkForEachNode( p, iObj )
        Acb_NtkFindRoots_rec(p, iObj, vBlock);
    // collect outputs reachable from targets
    Acb_NtkForEachCoDriver( p, iObj, i )
        if ( Acb_NtkFindRoots_rec(p, iObj, vBlock) )
            Vec_IntPush( vRoots, i );
    //Vec_IntPrint( vRoots );
    return vRoots;
}